

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void on_tcp_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if (nread < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x15a,"nread > 0");
    abort();
  }
  iVar1 = memcmp("hello again\n",buf->base,nread);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x15b,"memcmp(\"hello again\\n\", buf->base, nread) == 0");
    abort();
  }
  if (tcp != (uv_stream_t *)&tcp_connection) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x15c,"tcp == (uv_stream_t*)&tcp_connection");
    abort();
  }
  free(buf->base);
  tcp_read_cb_called = tcp_read_cb_called + 1;
  uv_close((uv_handle_t *)&tcp_connection,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&channel,(uv_close_cb)0x0);
  return;
}

Assistant:

static void on_tcp_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  ASSERT(nread > 0);
  ASSERT(memcmp("hello again\n", buf->base, nread) == 0);
  ASSERT(tcp == (uv_stream_t*)&tcp_connection);
  free(buf->base);

  tcp_read_cb_called++;

  uv_close((uv_handle_t*)tcp, NULL);
  uv_close((uv_handle_t*)&channel, NULL);
}